

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_iterator.cpp
# Opt level: O2

bool __thiscall QFSFileEngineIterator::advance(QFSFileEngineIterator *this)

{
  totally_ordered_wrapper<QFileInfoPrivate_*> tVar1;
  bool bVar2;
  QFileInfoPrivate *this_00;
  long in_FS_OFFSET;
  QFileSystemEntry entry;
  QSharedDataPointer<QFileInfoPrivate> local_a8;
  QFileSystemMetaData local_a0;
  undefined1 local_68 [64];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->nativeIterator)._M_t.
      super___uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>._M_t.
      super__Tuple_impl<0UL,_QFileSystemIterator_*,_std::default_delete<QFileSystemIterator>_>.
      super__Head_base<0UL,_QFileSystemIterator_*,_false>._M_head_impl == (QFileSystemIterator *)0x0
     ) {
    bVar2 = false;
  }
  else {
    local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_68);
    local_a0.knownFlagsMask.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
    local_a0.entryFlags.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
    local_a0.size_ = -1;
    local_a0.accessTime_ = 0;
    local_a0.birthTime_ = 0;
    local_a0.metadataChangeTime_ = 0;
    local_a0.modificationTime_ = 0;
    local_a0.userId_ = 0xfffffffe;
    local_a0.groupId_ = 0xfffffffe;
    bVar2 = QFileSystemIterator::advance
                      ((this->nativeIterator)._M_t.
                       super___uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QFileSystemIterator_*,_std::default_delete<QFileSystemIterator>_>
                       .super__Head_base<0UL,_QFileSystemIterator_*,_false>._M_head_impl,
                       (QFileSystemEntry *)local_68,&local_a0);
    if (bVar2) {
      this_00 = (QFileInfoPrivate *)operator_new(0x1e8);
      QFileInfoPrivate::QFileInfoPrivate(this_00,(QFileSystemEntry *)local_68,&local_a0);
      QFileInfo::QFileInfo((QFileInfo *)&local_a8,this_00);
      tVar1.ptr = (this->super_QAbstractFileEngineIterator).m_fileInfo.d_ptr.d.ptr;
      (this->super_QAbstractFileEngineIterator).m_fileInfo.d_ptr.d.ptr =
           (QFileInfoPrivate *)local_a8.d.ptr;
      local_a8.d.ptr =
           (totally_ordered_wrapper<QFileInfoPrivate_*>)
           (totally_ordered_wrapper<QFileInfoPrivate_*>)tVar1.ptr;
      QFileInfo::~QFileInfo((QFileInfo *)&local_a8);
    }
    else {
      std::__uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>::reset
                ((__uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)
                 &this->nativeIterator,(pointer)0x0);
    }
    QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngineIterator::advance()
{
    if (!nativeIterator)
        return false;

    QFileSystemEntry entry;
    QFileSystemMetaData data;
    if (nativeIterator->advance(entry, data)) {
        m_fileInfo = QFileInfo(new QFileInfoPrivate(entry, data));
        return true;
    } else {
        nativeIterator.reset();
        return false;
    }
}